

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_32x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  uint uVar11;
  uint8_t *puVar12;
  short sVar13;
  short sVar15;
  undefined1 auVar14 [16];
  short sVar16;
  ushort uVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  ushort uVar27;
  short sVar28;
  ushort uVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  ushort uVar33;
  short sVar34;
  ushort uVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar40 [16];
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  
  auVar14 = pshuflw(ZEXT116(top_row[0x1f]),ZEXT116(top_row[0x1f]),0);
  uVar1 = *(ulong *)left_column;
  sVar13 = auVar14._0_2_;
  sVar15 = auVar14._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = (char)(uVar1 >> 0x18);
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar10._11_4_ = 0;
  auVar14._3_12_ = SUB1512(auVar10 << 0x20,3);
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14[0] = (byte)uVar1;
  auVar14[1] = 0;
  auVar14[0xf] = 0;
  puVar12 = dst + 0x10;
  for (uVar11 = 0x1000100; uVar11 < 0xf0e0f0f; uVar11 = uVar11 + 0x2020202) {
    auVar40._4_4_ = uVar11;
    auVar40._0_4_ = uVar11;
    auVar40._8_4_ = uVar11;
    auVar40._12_4_ = uVar11;
    auVar40 = pshufb(auVar14,auVar40);
    sVar16 = auVar40._0_2_;
    sVar19 = auVar40._2_2_;
    sVar22 = auVar40._4_2_;
    sVar25 = auVar40._6_2_;
    sVar28 = auVar40._8_2_;
    sVar31 = auVar40._10_2_;
    sVar34 = auVar40._12_2_;
    sVar37 = auVar40._14_2_;
    uVar17 = sVar16 * 0xff + sVar13 + 0x80;
    uVar20 = sVar19 * 0xf0 + sVar15 * 0x10 + 0x80;
    uVar23 = sVar22 * 0xe1 + sVar13 * 0x1f + 0x80;
    uVar26 = sVar25 * 0xd2 + sVar15 * 0x2e + 0x80;
    uVar29 = sVar28 * 0xc4 + sVar13 * 0x3c + 0x80;
    uVar32 = sVar31 * 0xb6 + sVar15 * 0x4a + 0x80;
    uVar35 = sVar34 * 0xa9 + sVar13 * 0x57 + 0x80;
    uVar38 = sVar37 * 0x9d + sVar15 * 99 + 0x80;
    uVar41 = sVar16 * 0x91 + sVar13 * 0x6f + 0x80;
    uVar43 = sVar19 * 0x85 + sVar15 * 0x7b + 0x80;
    uVar45 = sVar22 * 0x7a + sVar13 * 0x86 + 0x80;
    uVar47 = sVar25 * 0x6f + sVar15 * 0x91 + 0x80;
    uVar49 = sVar28 * 0x65 + sVar13 * 0x9b + 0x80;
    uVar51 = sVar31 * 0x5c + sVar15 * 0xa4 + 0x80;
    uVar53 = sVar34 * 0x53 + sVar13 * 0xad + 0x80;
    uVar55 = sVar37 * 0x4a + sVar15 * 0xb6 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar21 = uVar20 >> 8;
    uVar24 = uVar23 >> 8;
    uVar27 = uVar26 >> 8;
    uVar30 = uVar29 >> 8;
    uVar33 = uVar32 >> 8;
    uVar36 = uVar35 >> 8;
    uVar39 = uVar38 >> 8;
    uVar42 = uVar41 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    uVar48 = uVar47 >> 8;
    uVar50 = uVar49 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    puVar12[-0x10] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
    puVar12[-0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
    puVar12[-0xe] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    puVar12[-0xd] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
    puVar12[-0xc] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    puVar12[-0xb] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
    puVar12[-10] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    puVar12[-9] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
    puVar12[-8] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
    puVar12[-7] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    puVar12[-6] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    puVar12[-5] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    puVar12[-4] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    puVar12[-3] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar12[-2] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    puVar12[-1] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    uVar17 = sVar16 * 0x42 + sVar13 * 0xbe + 0x80;
    uVar20 = sVar19 * 0x3b + sVar15 * 0xc5 + 0x80;
    uVar23 = sVar22 * 0x34 + sVar13 * 0xcc + 0x80;
    uVar26 = sVar25 * 0x2d + sVar15 * 0xd3 + 0x80;
    uVar29 = sVar28 * 0x27 + sVar13 * 0xd9 + 0x80;
    uVar32 = sVar31 * 0x22 + sVar15 * 0xde + 0x80;
    uVar35 = sVar34 * 0x1d + sVar13 * 0xe3 + 0x80;
    uVar38 = sVar37 * 0x19 + sVar15 * 0xe7 + 0x80;
    uVar41 = sVar16 * 0x15 + sVar13 * 0xeb + 0x80;
    uVar43 = sVar19 * 0x11 + sVar15 * 0xef + 0x80;
    uVar45 = sVar22 * 0xe + sVar13 * 0xf2 + 0x80;
    uVar47 = sVar25 * 0xc + sVar15 * 0xf4 + 0x80;
    uVar49 = sVar28 * 10 + sVar13 * 0xf6 + 0x80;
    uVar51 = sVar31 * 9 + sVar15 * 0xf7 + 0x80;
    uVar53 = sVar34 * 8 + sVar13 * 0xf8 + 0x80;
    uVar55 = sVar37 * 8 + sVar15 * 0xf8 + 0x80;
    uVar18 = uVar17 >> 8;
    uVar21 = uVar20 >> 8;
    uVar24 = uVar23 >> 8;
    uVar27 = uVar26 >> 8;
    uVar30 = uVar29 >> 8;
    uVar33 = uVar32 >> 8;
    uVar36 = uVar35 >> 8;
    uVar39 = uVar38 >> 8;
    uVar42 = uVar41 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    uVar48 = uVar47 >> 8;
    uVar50 = uVar49 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    *puVar12 = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
    puVar12[1] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
    puVar12[2] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    puVar12[3] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
    puVar12[4] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    puVar12[5] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
    puVar12[6] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
    puVar12[7] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
    puVar12[8] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
    puVar12[9] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    puVar12[10] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    puVar12[0xb] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    puVar12[0xc] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    puVar12[0xd] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar12[0xe] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    puVar12[0xf] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    puVar12 = puVar12 + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
}